

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaPValAttr(xmlSchemaParserCtxtPtr ctxt,xmlSchemaBasicItemPtr ownerItem,
                     xmlNodePtr ownerElem,char *name,xmlSchemaTypePtr type,xmlChar **value)

{
  int iVar1;
  xmlAttrPtr ownerItem_00;
  xmlSchemaTypePtr value_00;
  
  if (name == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    if (*(int *)name != 1) {
      if (type != (xmlSchemaTypePtr)0x0) {
        *(undefined8 *)type = 0;
      }
      xmlSchemaPErr(ctxt,(xmlNodePtr)ownerItem,0xbfd,
                    "Internal error: xmlSchemaPValAttr, the given type \'%s\' is not a built-in type.\n"
                    ,*(xmlChar **)(name + 0x10),(xmlChar *)0x0);
      return -1;
    }
    value_00 = type;
    ownerItem_00 = xmlSchemaGetPropNode((xmlNodePtr)ownerItem,(char *)ownerElem);
    if (ownerItem_00 != (xmlAttrPtr)0x0) {
      iVar1 = xmlSchemaPValAttrNode
                        (ctxt,(xmlSchemaBasicItemPtr)ownerItem_00,(xmlAttrPtr)name,type,
                         (xmlChar **)value_00);
      return iVar1;
    }
    iVar1 = 0;
  }
  if (type != (xmlSchemaTypePtr)0x0) {
    *(undefined8 *)type = 0;
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaPValAttr(xmlSchemaParserCtxtPtr ctxt,
		       xmlSchemaBasicItemPtr ownerItem,
		       xmlNodePtr ownerElem,
		       const char *name,
		       xmlSchemaTypePtr type,
		       const xmlChar **value)
{
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (type == NULL)) {
	if (value != NULL)
	    *value = NULL;
	return (-1);
    }
    if (type->type != XML_SCHEMA_TYPE_BASIC) {
	if (value != NULL)
	    *value = NULL;
	xmlSchemaPErr(ctxt, ownerElem,
	    XML_SCHEMAP_INTERNAL,
	    "Internal error: xmlSchemaPValAttr, the given "
	    "type '%s' is not a built-in type.\n",
	    type->name, NULL);
	return (-1);
    }
    attr = xmlSchemaGetPropNode(ownerElem, name);
    if (attr == NULL) {
	if (value != NULL)
	    *value = NULL;
	return (0);
    }
    return (xmlSchemaPValAttrNode(ctxt, ownerItem, attr,
	type, value));
}